

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void printInDevices(void)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long *in_RAX;
  void *__ptr;
  void *__ptr_00;
  ssize_t sVar4;
  char in_CL;
  int extraout_EDX;
  char *pcVar5;
  long *plVar6;
  char *pcVar7;
  uint uVar8;
  char **hints;
  long *local_38;
  
  pcVar7 = "pcm";
  pcVar5 = (char *)0x0;
  local_38 = in_RAX;
  iVar2 = snd_device_name_hint(0,"pcm",&local_38);
  if (iVar2 == 0) {
    lVar1 = *local_38;
    plVar6 = local_38;
    do {
      if (lVar1 == 0) {
        snd_device_name_free_hint(local_38);
        snd_config_update_free_global();
        return;
      }
      __ptr = (void *)snd_device_name_get_hint(lVar1,"NAME");
      __ptr_00 = (void *)snd_device_name_get_hint(*plVar6,"DESC");
      pcVar7 = (char *)snd_device_name_get_hint(*plVar6,"IOID");
      if (__ptr_00 != (void *)0x0 && __ptr != (void *)0x0) {
        pcVar5 = "Input/Output";
        if (pcVar7 != (char *)0x0) {
          iVar2 = strcmp(pcVar7,"Input");
          pcVar5 = "Input";
          if (iVar2 != 0) goto LAB_00102672;
        }
        printf("%s\n%s: <%s>\n\n",__ptr_00,pcVar5,__ptr);
      }
LAB_00102672:
      if (__ptr != (void *)0x0) {
        free(__ptr);
        free(__ptr_00);
        free(pcVar7);
      }
      lVar1 = plVar6[1];
      plVar6 = plVar6 + 1;
    } while( true );
  }
  printInDevices_cold_1();
  if (extraout_EDX == 1) {
    sVar4 = sendto(sock,pcVar5,(ulong)pcVar7 & 0xffffffff,0,(sockaddr *)addr->ai_addr,
                   addr->ai_addrlen);
    if (sVar4 == -1) {
LAB_001027bb:
      abort();
    }
    if (debug_nmea == '\x01') {
      fputs(pcVar5,_stderr);
      return;
    }
  }
  else {
    uVar8 = buffer_count + (int)pcVar7;
    uVar3 = 0;
    if (uVar8 < 0x800) {
      memcpy(buffer + buffer_count,pcVar5,(ulong)pcVar7 & 0xffffffff);
      uVar3 = uVar8;
    }
    buffer_count = uVar3;
    if (uVar3 != 0 && (char)extraout_EDX == in_CL) {
      sVar4 = sendto(sock,buffer,(ulong)uVar3,0,(sockaddr *)addr->ai_addr,addr->ai_addrlen);
      if (sVar4 == -1) goto LAB_001027bb;
      if (debug_nmea == '\x01') {
        nmea_sentence_received_cold_1();
      }
      buffer_count = 0;
    }
  }
  return;
}

Assistant:

void printInDevices() {
    char **hints;
    /* Enumerate sound devices */
    int err = snd_device_name_hint(0, "pcm", (void***)&hints);
    if (err != 0) {
        fprintf(stderr, "Can't read data\n");
        exit(EXIT_FAILURE);
    }

    char** n = hints;
    while (*n != NULL) {
        char *name = snd_device_name_get_hint(*n, "NAME");
        char *desc = snd_device_name_get_hint(*n, "DESC");
        char *type = snd_device_name_get_hint(*n, "IOID");
        if (name != NULL && desc != NULL) {
            if (type == NULL || !strcmp(type, "Input")) {
                printf("%s\n%s: <%s>\n\n", desc, type == NULL ? "Input/Output" : "Input",name);
            }
        }
        if (name != NULL) free(name);
        if (name != NULL) free(desc);
        if (name != NULL) free(type);
        n++;
    }

    //Free hint buffer too
    snd_device_name_free_hint((void**)hints);
    snd_config_update_free_global();
}